

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  MessageOptions *pMVar2;
  LogMessage *pLVar3;
  DescriptorBuilder *this_00;
  long lVar4;
  long lVar5;
  LogFinisher local_71;
  DescriptorProto *local_70;
  
  this_00 = this;
  local_70 = proto;
  if (*(long *)(message + 0x20) == 0) {
    pMVar2 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar2;
  }
  if (0 < *(int *)(message + 0x38)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x40);
      if ((local_70->nested_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&stack0xffffffffffffff98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)&stack0xffffffffffffff98,
                            "CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_71,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff98);
      }
      this_00 = this;
      CrossLinkMessage(this,(Descriptor *)(lVar1 + lVar4),
                       (DescriptorProto *)
                       (local_70->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar5 < *(int *)(message + 0x38));
  }
  if (0 < *(int *)(message + 0x48)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x50);
      if ((local_70->enum_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&stack0xffffffffffffff98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)&stack0xffffffffffffff98,
                            "CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_71,pLVar3);
        this_00 = (DescriptorBuilder *)&stack0xffffffffffffff98;
        internal::LogMessage::~LogMessage((LogMessage *)this_00);
      }
      CrossLinkEnum(this_00,(EnumDescriptor *)(lVar1 + lVar4),
                    (EnumDescriptorProto *)
                    (local_70->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar5 < *(int *)(message + 0x48));
  }
  if (0 < *(int *)(message + 0x2c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x30);
      if ((local_70->field_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&stack0xffffffffffffff98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)&stack0xffffffffffffff98,
                            "CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_71,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff98);
      }
      CrossLinkField(this,(FieldDescriptor *)(lVar1 + lVar4),
                     (FieldDescriptorProto *)
                     (local_70->field_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar5 < *(int *)(message + 0x2c));
  }
  if (0 < *(int *)(message + 0x68)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x70);
      if ((local_70->extension_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&stack0xffffffffffffff98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)&stack0xffffffffffffff98,
                            "CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_71,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff98);
      }
      CrossLinkField(this,(FieldDescriptor *)(lVar1 + lVar4),
                     (FieldDescriptorProto *)
                     (local_70->extension_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar5 < *(int *)(message + 0x68));
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(
    Descriptor* message, const DescriptorProto& proto) {
  if (message->options_ == NULL) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }
}